

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dhm.c
# Opt level: O1

int mbedtls_dhm_self_test(int verbose)

{
  int iVar1;
  char *__s;
  mbedtls_dhm_context dhm;
  mbedtls_dhm_context mStack_108;
  
  memset(&mStack_108,0,0xf8);
  if (verbose != 0) {
    printf("  DHM parameter load: ");
  }
  iVar1 = mbedtls_dhm_parse_dhm
                    (&mStack_108,
                     (uchar *)
                     "-----BEGIN DH PARAMETERS-----\r\nMIGHAoGBAJ419DBEOgmQTzo5qXl5fQcN9TN455wkOL7052HzxxRVMyhYmwQcgJvh\r\n1sa18fyfR9OiVEMYglOpkqVoGLN7qd5aQNNi5W7/C+VBdHTBJcGZJyyP5B3qcz32\r\n9mLJKudlVudV0Qxk5qUJaPZ/xupz0NyoVpviuiBOI1gNi8ovSXWzAgEC\r\n-----END DH PARAMETERS-----\r\n"
                     ,0xfb);
  if (verbose != 0) {
    __s = "passed\n";
    if (iVar1 != 0) {
      __s = "failed";
    }
    puts(__s);
  }
  mbedtls_dhm_free(&mStack_108);
  return (int)(iVar1 != 0);
}

Assistant:

int mbedtls_dhm_self_test( int verbose )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_dhm_context dhm;

    mbedtls_dhm_init( &dhm );

    if( verbose != 0 )
        mbedtls_printf( "  DHM parameter load: " );

    if( ( ret = mbedtls_dhm_parse_dhm( &dhm,
                    (const unsigned char *) mbedtls_test_dhm_params,
                    mbedtls_test_dhm_params_len ) ) != 0 )
    {
        if( verbose != 0 )
            mbedtls_printf( "failed\n" );

        ret = 1;
        goto exit;
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n\n" );

exit:
    mbedtls_dhm_free( &dhm );

    return( ret );
}